

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

void Cbs2_ManSatPrintStats(Cbs2_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  printf("CO = %8d  ",(ulong)(uint)p->pAig->vCos->nSize);
  pGVar1 = p->pAig;
  printf("AND = %8d  ",(ulong)(uint)(~(pGVar1->vCos->nSize + pGVar1->vCis->nSize) + pGVar1->nObjs));
  printf("Conf = %6d  ",(ulong)(uint)(p->Pars).nBTLimit);
  printf("JustMax = %5d  ",(ulong)(uint)(p->Pars).nJustLimit);
  putchar(10);
  dVar5 = (double)p->nSatUnsat;
  dVar4 = 0.0;
  dVar3 = 0.0;
  if (p->nSatTotal != 0) {
    dVar3 = (dVar5 * 100.0) / (double)p->nSatTotal;
  }
  if (p->nSatUnsat != 0) {
    dVar4 = (double)p->nConfUnsat / dVar5;
  }
  iVar2 = 0xa18405;
  printf("Unsat calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",dVar3,dVar4);
  Abc_Print(iVar2,"%s =","Time");
  dVar3 = 0.0;
  if (p->timeTotal != 0) {
    dVar3 = ((double)p->timeSatUnsat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUnsat / 1000000.0,dVar3);
  dVar4 = (double)p->nSatSat;
  dVar3 = 0.0;
  if (p->nSatTotal != 0) {
    dVar3 = (dVar4 * 100.0) / (double)p->nSatTotal;
  }
  dVar5 = 0.0;
  if (p->nSatSat != 0) {
    dVar5 = (double)p->nConfSat / dVar4;
  }
  iVar2 = 0xa18437;
  printf("Sat   calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",dVar3,dVar5);
  Abc_Print(iVar2,"%s =","Time");
  dVar3 = 0.0;
  if (p->timeTotal != 0) {
    dVar3 = ((double)p->timeSatSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatSat / 1000000.0,dVar3);
  dVar4 = (double)p->nSatUndec;
  dVar3 = 0.0;
  if (p->nSatUndec != 0) {
    dVar3 = (double)p->nConfUndec / dVar4;
  }
  dVar5 = 0.0;
  if (p->nSatTotal != 0) {
    dVar5 = (dVar4 * 100.0) / (double)p->nSatTotal;
  }
  iVar2 = 0xa18469;
  printf("Undef calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",dVar5,dVar3);
  Abc_Print(iVar2,"%s =","Time");
  dVar3 = 0.0;
  if (p->timeTotal != 0) {
    dVar3 = ((double)p->timeSatUndec * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUndec / 1000000.0,dVar3);
  Abc_Print(iVar2,"%s =","Total time");
  Abc_Print(iVar2,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
  return;
}

Assistant:

void Cbs2_ManSatPrintStats( Cbs2_Man_t * p )
{
    printf( "CO = %8d  ", Gia_ManCoNum(p->pAig) );
    printf( "AND = %8d  ", Gia_ManAndNum(p->pAig) );
    printf( "Conf = %6d  ", p->Pars.nBTLimit );
    printf( "JustMax = %5d  ", p->Pars.nJustLimit );
    printf( "\n" );
    printf( "Unsat calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatUnsat, p->nSatTotal? 100.0*p->nSatUnsat/p->nSatTotal :0.0, p->nSatUnsat? 1.0*p->nConfUnsat/p->nSatUnsat :0.0 );
    ABC_PRTP( "Time", p->timeSatUnsat, p->timeTotal );
    printf( "Sat   calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatSat,   p->nSatTotal? 100.0*p->nSatSat/p->nSatTotal :0.0, p->nSatSat? 1.0*p->nConfSat/p->nSatSat : 0.0 );
    ABC_PRTP( "Time", p->timeSatSat,   p->timeTotal );
    printf( "Undef calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatUndec, p->nSatTotal? 100.0*p->nSatUndec/p->nSatTotal :0.0, p->nSatUndec? 1.0*p->nConfUndec/p->nSatUndec : 0.0 );
    ABC_PRTP( "Time", p->timeSatUndec, p->timeTotal );
    ABC_PRT( "Total time", p->timeTotal );
}